

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int compare_files(char *original,char *generated)

{
  uint uVar1;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char ch2;
  char ch1;
  ulong local_38;
  
  log_info("compare_files","%-40s %s\n",original,generated);
  __stream = (FILE *)bin_open_read(original);
  __stream_00 = (FILE *)bin_open_read(generated);
  fseek(__stream,0,2);
  uVar2 = ftell(__stream);
  rewind(__stream);
  fseek(__stream_00,0,2);
  uVar3 = ftell(__stream_00);
  rewind(__stream_00);
  if (uVar2 == uVar3) {
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (long)uVar2) {
      uVar3 = uVar2;
    }
    local_38 = uVar2;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      fread(&ch1,1,1,__stream);
      fread(&ch2,1,1,__stream_00);
      if (ch1 != ch2) {
        log_error("compare_files",
                  "different byte found at position (%x). original 0x%02X != generated 0x%02X\n",
                  uVar4 & 0xffffffff);
        break;
      }
    }
    uVar1 = (uint)((long)uVar4 < (long)local_38);
  }
  else {
    log_error("compare_files","different file size:  %s (%ld byte) != %s (%ld byte)\n",original,
              uVar2,generated,uVar3);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int compare_files(const char *original, const char *generated) {
    log_info("compare_files", "%-40s %s\n", original, generated);

    FILE* fp_original = bin_open_read(original);
    FILE* fp_generated = bin_open_read(generated);

    // obtain file size:
    fseek (fp_original, 0, SEEK_END);

    long sz_original = ftell (fp_original);
    rewind (fp_original);

    // obtain file size:
    fseek (fp_generated, 0, SEEK_END);
    long sz_generated = ftell (fp_generated);
    rewind (fp_generated);

    if (sz_original != sz_generated) {
        log_error("compare_files", "different file size:  %s (%ld byte) != %s (%ld byte)\n", original, sz_original, generated, sz_generated);
        return RC_FAIL;
    }

    char ch1, ch2;
    for (int i=0; i<sz_original; i++) {
        fread(&ch1, 1, 1, fp_original);
        fread(&ch2, 1, 1, fp_generated);
        if (ch1 != ch2) {
            log_error("compare_files", "different byte found at position (%x). original 0x%02X != generated 0x%02X\n", i , ch1, ch2);
            return RC_FAIL;
        }
    }
    return RC_OK;
}